

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O2

void __thiscall nv::ColorBlock::boundsRange(ColorBlock *this,Color32 *start,Color32 *end)

{
  byte bVar1;
  anon_union_4_2_12391d8d_for_Color32_0 aVar2;
  byte bVar3;
  anon_union_4_2_12391d8d_for_Color32_0 aVar4;
  byte bVar5;
  uint i;
  uint uVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  byte bVar10;
  anon_union_4_2_12391d8d_for_Color32_0 aVar11;
  anon_union_4_2_12391d8d_for_Color32_0 aVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  byte bVar16;
  uint uVar17;
  
  aVar12.u = 0xff;
  lVar7 = 0;
  uVar9 = 0;
  aVar4.u = 0;
  uVar6 = 0;
  uVar14 = 0xff;
  uVar15 = 0xff;
  while( true ) {
    aVar11.u = aVar12.u & 0xff;
    bVar8 = (byte)uVar6;
    bVar16 = (byte)uVar9;
    bVar3 = aVar4.field_0.b;
    if (lVar7 == 0x10) break;
    bVar5 = this->m_color[lVar7].field_0.field_0.r;
    if (bVar5 < (byte)uVar15) {
      uVar15 = (uint)bVar5;
    }
    bVar1 = this->m_color[lVar7].field_0.field_0.g;
    if (bVar1 < (byte)uVar14) {
      uVar14 = (uint)bVar1;
    }
    aVar2 = (anon_union_4_2_12391d8d_for_Color32_0)
            *(anon_union_4_2_12391d8d_for_Color32_0 *)&this->m_color[lVar7].field_0.field_0;
    bVar10 = aVar12.field_0.b;
    aVar12.u = aVar11.u;
    if (aVar2._0_1_ < bVar10) {
      aVar12 = aVar2;
    }
    if (bVar8 < bVar5) {
      uVar6 = (uint)bVar5;
    }
    if (bVar16 < bVar1) {
      uVar9 = (uint)bVar1;
    }
    aVar4.u = aVar4.u & 0xff;
    if (bVar3 < aVar2._0_1_) {
      aVar4 = aVar2;
    }
    lVar7 = lVar7 + 1;
  }
  uVar6 = (uVar6 - uVar15 & 0xffff) >> 4;
  uVar9 = (uVar9 - uVar14 & 0xffff) >> 4;
  uVar17 = ((aVar4.u & 0xff) - (int)aVar11 & 0xffff) >> 4;
  uVar15 = (uVar6 & 0xff) + uVar15;
  if (0xfe < uVar15) {
    uVar15 = 0xff;
  }
  uVar14 = (uVar9 & 0xff) + uVar14;
  if (0xfe < uVar14) {
    uVar14 = 0xff;
  }
  uVar13 = (uVar17 & 0xff) + aVar11.u;
  if (0xfe < uVar13) {
    uVar13 = 0xff;
  }
  bVar5 = (byte)uVar6;
  uVar6 = (uint)(byte)(bVar8 - bVar5);
  if (bVar8 < bVar5) {
    uVar6 = 0;
  }
  bVar8 = (byte)uVar9;
  uVar9 = (uint)(byte)(bVar16 - bVar8);
  if (bVar16 < bVar8) {
    uVar9 = 0;
  }
  bVar16 = (byte)uVar17;
  uVar17 = (uint)(byte)(bVar3 - bVar16);
  if (bVar3 < bVar16) {
    uVar17 = 0;
  }
  (start->field_0).u = uVar13 | 0xff000000 | uVar14 << 8 | uVar15 << 0x10;
  (end->field_0).u = uVar17 | uVar9 << 8 | uVar6 << 0x10 | 0xff000000;
  return;
}

Assistant:

void ColorBlock::boundsRange(Color32 * start, Color32 * end) const
{
	nvDebugCheck(start != NULL);
	nvDebugCheck(end != NULL);

	Color32 minColor(255, 255, 255);
	Color32 maxColor(0, 0, 0);

	for(uint i = 0; i < 16; i++)
	{
		if (m_color[i].r < minColor.r) { minColor.r = m_color[i].r; }
		if (m_color[i].g < minColor.g) { minColor.g = m_color[i].g; }
		if (m_color[i].b < minColor.b) { minColor.b = m_color[i].b; }
		if (m_color[i].r > maxColor.r) { maxColor.r = m_color[i].r; }
		if (m_color[i].g > maxColor.g) { maxColor.g = m_color[i].g; }
		if (m_color[i].b > maxColor.b) { maxColor.b = m_color[i].b; }
	}

	// Offset range by 1/16 of the extents
	Color32 inset;
	inset.r = (maxColor.r - minColor.r) >> 4;
	inset.g = (maxColor.g - minColor.g) >> 4;
	inset.b = (maxColor.b - minColor.b) >> 4;

	minColor.r = (minColor.r + inset.r <= 255) ? minColor.r + inset.r : 255;
	minColor.g = (minColor.g + inset.g <= 255) ? minColor.g + inset.g : 255;
	minColor.b = (minColor.b + inset.b <= 255) ? minColor.b + inset.b : 255;

	maxColor.r = (maxColor.r >= inset.r) ? maxColor.r - inset.r : 0;
	maxColor.g = (maxColor.g >= inset.g) ? maxColor.g - inset.g : 0;
	maxColor.b = (maxColor.b >= inset.b) ? maxColor.b - inset.b : 0;

	*start = minColor;
	*end = maxColor;
}